

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter.cpp
# Opt level: O3

void QCompleter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  QArrayData *pQVar5;
  code *pcVar6;
  long lVar7;
  char cVar8;
  undefined4 uVar9;
  int iVar10;
  QString *prefix;
  long in_FS_OFFSET;
  QRect local_28;
  undefined4 uStack_18;
  undefined4 local_14;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_28.x2.m_i = (int)_a[1];
      local_28.y2.m_i = (int)((ulong)_a[1] >> 0x20);
      iVar10 = 0;
      goto LAB_0064d44c;
    case 1:
      local_28.x2.m_i = (int)_a[1];
      local_28.y2.m_i = (int)((ulong)_a[1] >> 0x20);
      iVar10 = 1;
      goto LAB_0064d44c;
    case 2:
      local_28.x2.m_i = (int)_a[1];
      local_28.y2.m_i = (int)((ulong)_a[1] >> 0x20);
      iVar10 = 2;
      goto LAB_0064d44c;
    case 3:
      local_28.x2.m_i = (int)_a[1];
      local_28.y2.m_i = (int)((ulong)_a[1] >> 0x20);
      iVar10 = 3;
LAB_0064d44c:
      local_28.y1.m_i = 0;
      local_28.x1.m_i = 0;
      QMetaObject::activate(_o,&staticMetaObject,iVar10,(void **)&local_28);
      goto switchD_0064d0b5_caseD_3;
    case 4:
      prefix = (QString *)_a[1];
switchD_0064d112_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setCompletionPrefix((QCompleter *)_o,prefix);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        complete((QCompleter *)_o,(QRect *)_a[1]);
        return;
      }
      break;
    case 6:
      local_28.x1.m_i = 0;
      local_28.y1.m_i = 0;
      local_28.x2.m_i = -1;
      local_28.y2.m_i = -1;
      complete((QCompleter *)_o,&local_28);
      goto switchD_0064d0b5_caseD_3;
    case 7:
      cVar8 = *_a[1];
LAB_0064d418:
      if (*(char *)(*(long *)(_o + 8) + 0xcc) != cVar8) {
        *(char *)(*(long *)(_o + 8) + 0xcc) = cVar8;
      }
      goto switchD_0064d0b5_caseD_3;
    case 8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QCompleterPrivate::_q_complete(*(QCompleterPrivate **)(_o + 8),*(QModelIndex *)_a[1],false);
        return;
      }
      break;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QCompleterPrivate::_q_completionSelected
                  (*(QCompleterPrivate **)(_o + 8),(QItemSelection *)_a[1]);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QCompleterPrivate::_q_autoResizePopup(*(QCompleterPrivate **)(_o + 8));
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QCompleterPrivate::_q_fileSystemModelDirectoryLoaded
                  (*(QCompleterPrivate **)(_o + 8),(QString *)_a[1]);
        return;
      }
      break;
    default:
      goto switchD_0064d0b5_caseD_3;
    }
    goto LAB_0064d529;
  case ReadProperty:
    if (8 < (uint)_id) break;
    puVar1 = (undefined8 *)*_a;
    switch(_id) {
    case 0:
      lVar7 = *(long *)(_o + 8);
      piVar2 = *(int **)(lVar7 + 0xa0);
      uVar3 = *(undefined8 *)(lVar7 + 0xa8);
      uVar4 = *(undefined8 *)(lVar7 + 0xb0);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      pQVar5 = (QArrayData *)*puVar1;
      *puVar1 = piVar2;
      puVar1[1] = uVar3;
      puVar1[2] = uVar4;
      if (pQVar5 != (QArrayData *)0x0) {
        LOCK();
        (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            QArrayData::deallocate(pQVar5,2,0x10);
            return;
          }
          goto LAB_0064d529;
        }
      }
      goto switchD_0064d0b5_caseD_3;
    case 1:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 200);
      break;
    case 2:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0x9c);
      break;
    case 3:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0x98);
      break;
    case 4:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xc0);
      break;
    case 5:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xbc);
      break;
    case 6:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xc4);
      break;
    case 7:
      uVar9 = *(undefined4 *)(*(long *)(_o + 8) + 0xb8);
      break;
    case 8:
      *(undefined1 *)puVar1 = *(undefined1 *)(*(long *)(_o + 8) + 0xcc);
      goto switchD_0064d0b5_caseD_3;
    }
    *(undefined4 *)puVar1 = uVar9;
    break;
  case WriteProperty:
    if ((uint)_id < 9) {
      prefix = (QString *)*_a;
      switch(_id) {
      case 0:
        goto switchD_0064d112_caseD_0;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setModelSorting((QCompleter *)_o,*(ModelSorting *)&(prefix->d).d);
          return;
        }
        break;
      case 2:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setFilterMode((QCompleter *)_o,
                        (QFlagsStorageHelper<Qt::MatchFlag,_4>)
                        *(QFlagsStorageHelper<Qt::MatchFlag,_4> *)&(prefix->d).d);
          return;
        }
        break;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setCompletionMode((QCompleter *)_o,*(CompletionMode *)&(prefix->d).d);
          return;
        }
        break;
      case 4:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setCompletionColumn((QCompleter *)_o,*(int *)&(prefix->d).d);
          return;
        }
        break;
      case 5:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setCompletionRole((QCompleter *)_o,*(int *)&(prefix->d).d);
          return;
        }
        break;
      case 6:
        iVar10 = *(int *)&(prefix->d).d;
        if (iVar10 < 0) {
          local_28.x1.m_i = 2;
          local_28.y1.m_i = 0;
          local_28.x2.m_i = 0;
          local_28.y2.m_i = 0;
          uStack_18 = 0;
          local_14 = 0;
          local_10 = "default";
          QMessageLogger::warning
                    ((char *)&local_28,
                     "QCompleter::setMaxVisibleItems: Invalid max visible items (%d) must be >= 0");
        }
        else {
          *(int *)(*(long *)(_o + 8) + 0xc4) = iVar10;
        }
        goto switchD_0064d0b5_caseD_3;
      case 7:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          setCaseSensitivity((QCompleter *)_o,*(CaseSensitivity *)&(prefix->d).d);
          return;
        }
        break;
      case 8:
        cVar8 = *(char *)&(prefix->d).d;
        goto LAB_0064d418;
      }
      goto LAB_0064d529;
    }
    break;
  case IndexOfMethod:
    pcVar6 = *_a[1];
    lVar7 = *(long *)((long)_a[1] + 8);
    if (pcVar6 == activated && lVar7 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar6 == activated && lVar7 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar6 == highlighted && lVar7 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar6 == highlighted && lVar7 == 0) {
      *(undefined4 *)*_a = 3;
    }
  }
switchD_0064d0b5_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0064d529:
  __stack_chk_fail();
}

Assistant:

void QCompleter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompleter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->setCompletionPrefix((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->complete((*reinterpret_cast< std::add_pointer_t<QRect>>(_a[1]))); break;
        case 6: _t->complete(); break;
        case 7: _t->setWrapAround((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->d_func()->_q_complete((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 9: _t->d_func()->_q_completionSelected((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1]))); break;
        case 10: _t->d_func()->_q_autoResizePopup(); break;
        case 11: _t->d_func()->_q_fileSystemModelDirectoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::activated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::activated, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QString & )>(_a, &QCompleter::highlighted, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCompleter::*)(const QModelIndex & )>(_a, &QCompleter::highlighted, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->completionPrefix(); break;
        case 1: *reinterpret_cast<ModelSorting*>(_v) = _t->modelSorting(); break;
        case 2: *reinterpret_cast<Qt::MatchFlags*>(_v) = _t->filterMode(); break;
        case 3: *reinterpret_cast<CompletionMode*>(_v) = _t->completionMode(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->completionColumn(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->completionRole(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->maxVisibleItems(); break;
        case 7: *reinterpret_cast<Qt::CaseSensitivity*>(_v) = _t->caseSensitivity(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wrapAround(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCompletionPrefix(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setModelSorting(*reinterpret_cast<ModelSorting*>(_v)); break;
        case 2: _t->setFilterMode(*reinterpret_cast<Qt::MatchFlags*>(_v)); break;
        case 3: _t->setCompletionMode(*reinterpret_cast<CompletionMode*>(_v)); break;
        case 4: _t->setCompletionColumn(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCompletionRole(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setMaxVisibleItems(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setCaseSensitivity(*reinterpret_cast<Qt::CaseSensitivity*>(_v)); break;
        case 8: _t->setWrapAround(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}